

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,optional<long> *target,string_view name,string_view value)

{
  _Storage<long,_true> _Var1;
  string_view value_00;
  string_view name_00;
  char *in_RCX;
  _Storage<long,_true> *in_RDX;
  size_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t in_R8;
  optional<long> oVar2;
  string *error;
  undefined7 uStack_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  pbVar3 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  name_00._M_str = (char *)pbVar3;
  name_00._M_len = in_R8;
  value_00._M_str = in_RCX;
  value_00._M_len = in_RSI;
  oVar2 = parseInt<long>(name_00,value_00,(string *)in_RDX);
  in_RDX->_M_value =
       oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  _Var1._M_value._1_7_ = uStack_37;
  _Var1._M_value._0_1_ =
       oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  in_RDX[1] = _Var1;
  return in_RDI;
}

Assistant:

std::string CommandLine::Option::set(std::optional<int64_t>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseInt<int64_t>(name, value, error);
    return error;
}